

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialalignment.cpp
# Opt level: O0

bool __thiscall Alignment::StaticAlignmentEpoch(Alignment *this,int duration)

{
  size_type sVar1;
  size_type sVar2;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar3;
  ostream *this_00;
  int in_ESI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  double dVar4;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  PVar5;
  exception *e;
  bool flag;
  double Euler [3];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  temp;
  int i_1;
  Matrix3d C;
  Matrix3d Cnb;
  Matrix3d observation;
  Vector3d vb;
  int i;
  Vector3d Omega_b;
  Vector3d gb;
  int count;
  Matrix3d reference;
  Vector3d vn;
  Vector3d Omega_n;
  Vector3d gn;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffa88;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffa90;
  undefined7 in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffa9f;
  XprTypeNested in_stack_fffffffffffffaa8;
  TransposeReturnType in_stack_fffffffffffffab0;
  TransposeReturnType in_stack_fffffffffffffab8;
  RhsNested in_stack_fffffffffffffac0;
  LhsNested in_stack_fffffffffffffac8;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffad0;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_01;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>_>
  *this_02;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffb20;
  int local_3ac;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_278 [156];
  int local_1dc;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>_>
  local_1a0 [28];
  int local_184;
  double local_78;
  undefined8 local_70;
  double local_68;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  int local_14;
  bool local_1;
  
  local_14 = in_ESI;
  sVar1 = std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::size((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_RDI);
  sVar2 = std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::size((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)(in_RDI + 0x18));
  if (sVar1 == sVar2) {
    local_38 = 0;
    local_40 = 0;
    local_48 = 0xc0239655051512b7;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffac0.m_xpr,
               (Scalar *)in_stack_fffffffffffffab8.m_matrix,
               (Scalar *)in_stack_fffffffffffffab0.m_matrix,
               (Scalar *)in_stack_fffffffffffffaa8.m_matrix);
    dVar4 = Deg2Rad(30.5278);
    local_68 = cos(dVar4);
    local_68 = local_68 * 7.292115e-05;
    local_70 = 0;
    dVar4 = Deg2Rad(30.5278);
    local_78 = sin(dVar4);
    local_78 = local_78 * -7.292115e-05;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffac0.m_xpr,
               (Scalar *)in_stack_fffffffffffffab8.m_matrix,
               (Scalar *)in_stack_fffffffffffffab0.m_matrix,
               (Scalar *)in_stack_fffffffffffffaa8.m_matrix);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (in_RDI,in_stack_fffffffffffffb20);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x1b660e);
    Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
              (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8,
               (Index)in_stack_fffffffffffffac0.m_xpr,
               (int)((ulong)in_stack_fffffffffffffab8.m_matrix >> 0x20),
               (int)in_stack_fffffffffffffab8.m_matrix);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)
               in_stack_fffffffffffffa90,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa88);
    Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
              (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8,
               (Index)in_stack_fffffffffffffac0.m_xpr,
               (int)((ulong)in_stack_fffffffffffffab8.m_matrix >> 0x20),
               (int)in_stack_fffffffffffffab8.m_matrix);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)
               in_stack_fffffffffffffa90,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa88);
    Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
              (in_stack_fffffffffffffad0,(Index)in_stack_fffffffffffffac8,
               (Index)in_stack_fffffffffffffac0.m_xpr,
               (int)((ulong)in_stack_fffffffffffffab8.m_matrix >> 0x20),
               (int)in_stack_fffffffffffffab8.m_matrix);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)
               in_stack_fffffffffffffa90,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa88);
    local_184 = 0;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa90,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffa88);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa90,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffa88);
    PVar5.m_rhs.m_xpr = in_stack_fffffffffffffac0.m_xpr;
    PVar5.m_lhs = in_stack_fffffffffffffac8;
    local_1dc = 0;
    while( true ) {
      other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(long)local_1dc;
      pMVar3 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               std::
               vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ::size((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)in_RDI);
      if (pMVar3 <= other) break;
      if (local_184 < local_14) {
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)in_RDI,(long)local_1dc);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   in_stack_fffffffffffffab0.m_matrix,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   in_stack_fffffffffffffaa8.m_matrix);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)(in_RDI + 0x18),(long)local_1dc);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   in_stack_fffffffffffffab0.m_matrix,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   in_stack_fffffffffffffaa8.m_matrix);
        local_184 = local_184 + 1;
      }
      else {
        this_02 = local_1a0;
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                  (in_RDI,other);
        Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x1b6809);
        this_01 = local_278;
        Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
                  (this_01,(Index)PVar5.m_lhs,(Index)PVar5.m_rhs.m_xpr.m_xpr,
                   (int)((ulong)in_stack_fffffffffffffab8.m_matrix >> 0x20),
                   (int)in_stack_fffffffffffffab8.m_matrix);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)
                   in_stack_fffffffffffffa90,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa88);
        Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
                  (this_01,(Index)PVar5.m_lhs,(Index)PVar5.m_rhs.m_xpr.m_xpr,
                   (int)((ulong)in_stack_fffffffffffffab8.m_matrix >> 0x20),
                   (int)in_stack_fffffffffffffab8.m_matrix);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)
                   in_stack_fffffffffffffa90,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa88);
        Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::block<int,int>
                  (this_01,(Index)PVar5.m_lhs,(Index)PVar5.m_rhs.m_xpr.m_xpr,
                   (int)((ulong)in_stack_fffffffffffffab8.m_matrix >> 0x20),
                   (int)in_stack_fffffffffffffab8.m_matrix);
        Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false> *)
                   in_stack_fffffffffffffa90,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa88);
        Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::inverse
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                   CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
        PVar5 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          (in_stack_fffffffffffffa90,
                           (MatrixBase<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                           in_stack_fffffffffffffa88);
        Eigen::Matrix<double,3,3,0,3,3>::
        Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>,0>>
                  ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffa90,
                   (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
                    *)in_stack_fffffffffffffa88);
        in_stack_fffffffffffffab8 =
             Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                        in_stack_fffffffffffffa88);
        Eigen::Matrix<double,3,3,0,3,3>::Matrix<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
                  ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffa90,
                   (EigenBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                   in_stack_fffffffffffffa88);
        for (local_3ac = 0; local_3ac < 0x1e; local_3ac = local_3ac + 1) {
          in_stack_fffffffffffffab0 =
               Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                          in_stack_fffffffffffffa88);
          in_stack_fffffffffffffaa8.m_matrix =
               (non_const_type)
               Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::inverse
                         ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                          CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
          Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                     in_stack_fffffffffffffab8.m_matrix,
                     (MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                      *)in_stack_fffffffffffffab0.m_matrix);
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>const>>
          ::operator*(this_02,(double *)this_01);
          Eigen::Matrix<double,3,3,0,3,3>::operator=
                    ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffa90,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                      *)in_stack_fffffffffffffa88);
        }
        Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
                  ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffa90,
                   (Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffa88);
        in_stack_fffffffffffffa9f =
             CalculateEuler((Alignment *)PVar5.m_rhs.m_xpr.m_xpr,in_stack_fffffffffffffab8.m_matrix,
                            (double *)in_stack_fffffffffffffab0.m_matrix);
        if (!(bool)in_stack_fffffffffffffa9f) {
          this_00 = std::operator<<((ostream *)&std::cout,"calculate Euler wrong");
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          return false;
        }
        in_stack_fffffffffffffa88 =
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)(in_RDI + 0xc0);
        Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                  ((Matrix<double,_3,_1,_0,_3,_1> *)PVar5.m_rhs.m_xpr.m_xpr,
                   (Scalar *)in_stack_fffffffffffffab8.m_matrix,
                   (Scalar *)in_stack_fffffffffffffab0.m_matrix,
                   (Scalar *)in_stack_fffffffffffffaa8.m_matrix);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)in_stack_fffffffffffffa90,(value_type *)in_stack_fffffffffffffa88);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
        Eigen::Matrix<double,3,1,0,3,1>::operator=
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa90,
                   in_stack_fffffffffffffa88);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
        Eigen::Matrix<double,3,1,0,3,1>::operator=
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa90,
                   in_stack_fffffffffffffa88);
        local_184 = 0;
      }
      local_1dc = local_1dc + 1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Alignment::StaticAlignmentEpoch(int duration)
{
    if(OriginData[0].size() != OriginData[1].size())
        return false;

    Vector3d gn(0, 0, -GRAVITY);
    Vector3d Omega_n(OMEGA * cos(Deg2Rad(PHI)), 0, -OMEGA * sin(Deg2Rad(PHI)));
    Vector3d vn = gn.cross(Omega_n);
    Matrix3d reference;
    reference.block(0, 0, 3, 1) = gn;
    reference.block(0, 1, 3, 1) = Omega_n;
    reference.block(0, 2, 3, 1) = vn;

    int count = 0;
    Vector3d gb = Vector3d::Zero();
    Vector3d Omega_b = Vector3d::Zero();
    for(int i = 0; i < this->OriginData[0].size(); ++i)
    {
        if(count < duration)
        {
            gb += OriginData[0][i];
            Omega_b += OriginData[1][i];
            count ++;
            continue;
        }
        Vector3d vb = (gb).cross(Omega_b);
        Matrix3d observation;
        observation.block(0, 0, 3, 1) = gb;
        observation.block(0, 1, 3, 1) = Omega_b;
        observation.block(0, 2, 3, 1) = vb;

        try
        {
            Matrix3d Cnb = observation * reference.inverse();
            Matrix3d C = Cnb.transpose();
            for(int i = 0; i < 30; ++i)
            {
                auto temp = (C + (C.transpose()).inverse()) * 0.5;
                C = temp;
            }
            double Euler[3];
            bool flag = this->CalculateEuler(C, Euler);
            if(!flag)
            {
                cout << "calculate Euler wrong" << endl;
                return false;
            }
            this->Euler_epoch.push_back(Vector3d(Euler[0], Euler[1], Euler[2]));
        }
        catch(const std::exception& e)
        {
            std::cout << e.what() << '\n';
            return false;
        }
        gb = Vector3d::Zero();
        Omega_b = Vector3d::Zero();
        count = 0;
    }

    return true;
}